

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_18::DoInlining::runOnFunction(DoInlining *this,Module *module,Function *func)

{
  const_iterator into;
  bool bVar1;
  pointer pvVar2;
  vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *this_00;
  reference pIVar3;
  PassOptions *options;
  undefined1 local_68 [8];
  InliningAction action;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *__range2;
  vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *actions;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
  local_28;
  const_iterator iter;
  Function *func_local;
  Module *module_local;
  DoInlining *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
               )func;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
       ::find(this->chosenActions,(key_type *)func);
  actions = (vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
             *)std::
               unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
               ::end(this->chosenActions);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                      *)&actions);
  if (!bVar1) {
    __assert_fail("iter != chosenActions.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x29c,
                  "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
                 );
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_false,_true>
                         *)&local_28);
  this_00 = &pvVar2->second;
  bVar1 = std::
          vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
          ::empty(this_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!actions.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x29e,
                  "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
                 );
  }
  __end2 = std::
           vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
           ::begin(this_00);
  action._16_8_ =
       std::
       vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
                                *)&action.insideATry);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
             ::operator*(&__end2);
    into = iter;
    local_68 = (undefined1  [8])pIVar3->callSite;
    action.callSite = (Expression **)pIVar3->contents;
    action.contents = *(Function **)&pIVar3->insideATry;
    options = Pass::getPassOptions(&this->super_Pass);
    doCodeInlining(module,(Function *)
                          into.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                          ._M_cur,(InliningAction *)local_68,options);
    __gnu_cxx::
    __normal_iterator<const_wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
    ::operator++(&__end2);
  }
  updateAfterInlining(module,(Function *)
                             iter.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                             ._M_cur);
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    auto iter = chosenActions.find(func->name);
    // We must be called on a function that we actually want to inline into.
    assert(iter != chosenActions.end());
    const auto& actions = iter->second;
    assert(!actions.empty());

    // Inline all the code first, then update func once at the end (which saves
    // e.g. running ReFinalize after each action, of which there might be many).
    for (auto action : actions) {
      doCodeInlining(module, func, action, getPassOptions());
    }
    updateAfterInlining(module, func);
  }